

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

string * __thiscall
libcellml::Analyser::AnalyserImpl::expression_abi_cxx11_
          (string *__return_storage_ptr__,AnalyserImpl *this,AnalyserEquationAstPtr *ast,
          bool includeHierarchy)

{
  bool bVar1;
  string *generatorProfile;
  char *__rhs;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  shared_ptr<libcellml::AnalyserEquationAst> local_b8;
  undefined1 local_a8 [8];
  AnalyserEquationAstPtr equationAstGrandparent;
  AnalyserEquationAstPtr equationAstParent;
  AnalyserEquationAstPtr equationAst;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_22;
  byte local_21;
  __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Stack_20;
  bool includeHierarchy_local;
  AnalyserEquationAstPtr *ast_local;
  AnalyserImpl *this_local;
  string *res;
  
  local_22 = 0;
  generatorProfile = __return_storage_ptr__;
  local_21 = includeHierarchy;
  p_Stack_20 = (__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)ast;
  ast_local = (AnalyserEquationAstPtr *)this;
  this_local = (AnalyserImpl *)__return_storage_ptr__;
  Generator::equationCode_abi_cxx11_
            (&local_68,(Generator *)ast,(AnalyserEquationAstPtr *)&this->mGeneratorProfile,
             (GeneratorProfilePtr *)__return_storage_ptr__);
  std::operator+(&local_48,"\'",&local_68);
  std::operator+(__return_storage_ptr__,&local_48,"\'");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if ((local_21 & 1) != 0) {
    std::shared_ptr<libcellml::AnalyserEquationAst>::shared_ptr
              ((shared_ptr<libcellml::AnalyserEquationAst> *)
               &equationAstParent.
                super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<libcellml::AnalyserEquationAst> *)p_Stack_20);
    std::
    __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(p_Stack_20);
    AnalyserEquationAst::parent
              ((AnalyserEquationAst *)
               &equationAstGrandparent.
                super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = std::operator!=((shared_ptr<libcellml::AnalyserEquationAst> *)
                            &equationAstGrandparent.
                             super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(nullptr_t)0x0);
    if (bVar1) {
      std::
      __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&equationAstGrandparent.
                       super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      AnalyserEquationAst::parent((AnalyserEquationAst *)local_a8);
    }
    else {
      std::shared_ptr<libcellml::AnalyserEquationAst>::shared_ptr
                ((shared_ptr<libcellml::AnalyserEquationAst> *)local_a8,(nullptr_t)0x0);
    }
    while (bVar1 = std::operator!=((shared_ptr<libcellml::AnalyserEquationAst> *)
                                   &equationAstGrandparent.
                                    super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(nullptr_t)0x0), bVar1) {
      std::shared_ptr<libcellml::AnalyserEquationAst>::operator=
                ((shared_ptr<libcellml::AnalyserEquationAst> *)
                 &equationAstParent.
                  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (shared_ptr<libcellml::AnalyserEquationAst> *)
                 &equationAstGrandparent.
                  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<libcellml::AnalyserEquationAst>::operator=
                ((shared_ptr<libcellml::AnalyserEquationAst> *)
                 &equationAstGrandparent.
                  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<libcellml::AnalyserEquationAst> *)local_a8);
      bVar1 = std::operator!=((shared_ptr<libcellml::AnalyserEquationAst> *)
                              &equationAstGrandparent.
                               super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,(nullptr_t)0x0);
      if (bVar1) {
        std::
        __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&equationAstGrandparent.
                         super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
        AnalyserEquationAst::parent((AnalyserEquationAst *)&local_b8);
      }
      else {
        std::shared_ptr<libcellml::AnalyserEquationAst>::shared_ptr(&local_b8,(nullptr_t)0x0);
      }
      std::shared_ptr<libcellml::AnalyserEquationAst>::operator=
                ((shared_ptr<libcellml::AnalyserEquationAst> *)local_a8,&local_b8);
      std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr(&local_b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158," in",&local_159);
      bVar1 = std::operator==((shared_ptr<libcellml::AnalyserEquationAst> *)
                              &equationAstGrandparent.
                               super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,(nullptr_t)0x0);
      generatorProfile = (string *)CONCAT71((int7)((ulong)generatorProfile >> 8),bVar1);
      __rhs = "";
      if (bVar1) {
        __rhs = " equation";
      }
      std::operator+(&local_138,&local_158,__rhs);
      std::operator+(&local_118,&local_138," \'");
      Generator::equationCode_abi_cxx11_
                (&local_180,
                 (Generator *)
                 &equationAstParent.
                  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(AnalyserEquationAstPtr *)&this->mGeneratorProfile,
                 (GeneratorProfilePtr *)generatorProfile);
      std::operator+(&local_f8,&local_118,&local_180);
      std::operator+(&local_d8,&local_f8,"\'");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    componentName_abi_cxx11_
              (&local_1e0,this,
               (AnalyserEquationAstPtr *)
               &equationAstParent.
                super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::operator+(&local_1c0," in component \'",&local_1e0);
    std::operator+(&local_1a0,&local_1c0,"\'");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserEquationAst> *)local_a8);
    std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserEquationAst> *)
               &equationAstGrandparent.
                super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserEquationAst> *)
               &equationAstParent.
                super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Analyser::AnalyserImpl::expression(const AnalyserEquationAstPtr &ast,
                                               bool includeHierarchy)
{
    // Return the generated code for the given AST, specifying the equation and
    // component in which it is, if needed and requested.

    std::string res = "'" + Generator::equationCode(ast, mGeneratorProfile) + "'";

    if (includeHierarchy) {
        auto equationAst = ast;
        auto equationAstParent = ast->parent();
        auto equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

        while (equationAstParent != nullptr) {
            equationAst = equationAstParent;
            equationAstParent = equationAstGrandparent;
            equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

            res += std::string(" in")
                   + ((equationAstParent == nullptr) ? " equation" : "")
                   + " '" + Generator::equationCode(equationAst, mGeneratorProfile) + "'";
        }

        res += " in component '" + componentName(equationAst) + "'";
    }

    return res;
}